

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::Run(App *this,ILayoutPtr *layout)

{
  IInput **ppIVar1;
  IKeyHandler *pIVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  size_type sVar6;
  undefined4 extraout_var;
  IWindow *parent;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t ch;
  element_type *peVar7;
  ILayoutPtr IVar8;
  int local_e8;
  int local_e4;
  Event event;
  ILayoutPtr active;
  __shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2> local_98;
  MEVENT rawMouseEvent;
  string kn;
  MouseButtonState mouseButtonState;
  
  kn._M_dataplus._M_p = (pointer)&kn.field_2;
  kn._M_string_length = 0;
  kn.field_2._M_local_buf[0] = '\0';
  (this->state).input = (IInput *)0x0;
  (this->state).keyHandler = (IKeyHandler *)0x0;
  local_e4 = Screen::GetWidth();
  local_e8 = Screen::GetHeight();
  std::__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,&layout->super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>);
  ChangeLayout(this,(ILayoutPtr *)&local_98);
  ppIVar1 = &(this->state).input;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  mouseButtonState.wasDown = false;
  mouseButtonState.clicked = false;
  mouseButtonState.doubleClicked = false;
  mouseButtonState.lastX = -1;
  mouseButtonState.lastY = -1;
  mouseButtonState.time = -1;
LAB_00171dc8:
  if ((this->quit != false) || ((disconnected & 1) != 0)) {
    OverlayStack::Clear(&overlays);
    std::__cxx11::string::~string((string *)&kn);
    return;
  }
  std::__cxx11::string::assign((char *)&kn);
  sVar6 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  if (sVar6 != 0) {
    std::__cxx11::string::_M_assign((string *)&kn);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
    goto LAB_00171ec5;
  }
  if ((*ppIVar1 == (IInput *)0x0) ||
     (iVar5 = (*(((this->state).focused.
                  super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_IOrderable)._vptr_IOrderable[0x22])(), CONCAT44(extraout_var,iVar5) == 0)) {
    iVar5 = wgetch(_stdscr);
    ch = extraout_RDX_00;
  }
  else {
    iVar5 = (*(((this->state).focused.
                super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_IOrderable)._vptr_IOrderable[0x22])();
    keypad(iVar5,1);
    wtimeout(iVar5,0x4b);
    iVar5 = wgetch(iVar5);
    ch = extraout_RDX;
  }
  if (iVar5 != -1) goto code_r0x00171e64;
  goto LAB_00172016;
code_r0x00171e64:
  cursespp::key::Read_abi_cxx11_((string *)&active,(key *)(long)iVar5,ch);
  std::__cxx11::string::operator=((string *)&kn,(string *)&active);
  std::__cxx11::string::~string((string *)&active);
  if (((this->keyHook).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar3 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(&this->keyHook,&kn), bVar3)) goto LAB_00171dc8;
  if (iVar5 == 9) {
    FocusNextInLayout(this);
    goto LAB_00172016;
  }
LAB_00171ec5:
  bVar3 = std::operator==(&kn,"KEY_BTAB");
  if (bVar3) {
    FocusPrevInLayout(this);
    goto LAB_00172016;
  }
  _Var4 = std::operator==(&kn,&this->quitKey);
  if (_Var4) {
    this->quit = true;
    goto LAB_00172016;
  }
  if ((this->mouseEnabled == true) && (bVar3 = std::operator==(&kn,"KEY_MOUSE"), bVar3)) {
    iVar5 = getmouse(&rawMouseEvent);
    if (iVar5 != 0) goto LAB_00172016;
    WindowState::ActiveLayout((WindowState *)&active);
    if (active.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      parent = (IWindow *)
               __dynamic_cast(active.
                              super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,&ILayout::typeinfo,&IWindow::typeinfo,0xfffffffffffffffe);
      IMouseHandler::Event::Event(&event,&rawMouseEvent,parent);
      if ((event.state & 0x210000) == 0) {
        bVar3 = MouseButtonState::Update(&mouseButtonState,&rawMouseEvent);
        if (bVar3) {
          event.state = MouseButtonState::ToCursesState(&mouseButtonState);
          peVar7 = active.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_00172094;
        }
      }
      else {
        peVar7 = (element_type *)
                 (this->state).focused.
                 super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar7 != (element_type *)0x0) {
LAB_00172094:
          (*(peVar7->super_IMouseHandler)._vptr_IMouseHandler[2])
                    (&peVar7->super_IMouseHandler,&event);
        }
      }
    }
  }
  else {
    if ((((*ppIVar1 != (IInput *)0x0) &&
         ((iVar5 = (*(((this->state).focused.
                       super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     super_IOrderable)._vptr_IOrderable[0x23])(), (char)iVar5 != '\0' &&
          (iVar5 = (*(*ppIVar1)->_vptr_IInput[2])(*ppIVar1,&kn), (char)iVar5 != '\0')))) ||
        (((this->keyHandler).super__Function_base._M_manager != (_Manager_type)0x0 &&
         (bVar3 = std::
                  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::operator()(&this->keyHandler,&kn), bVar3)))) ||
       ((pIVar2 = (this->state).keyHandler, pIVar2 != (IKeyHandler *)0x0 &&
        (iVar5 = (*pIVar2->_vptr_IKeyHandler[2])(pIVar2,&kn), (char)iVar5 != '\0'))))
    goto LAB_00172016;
    IVar8 = WindowState::ActiveLayout((WindowState *)&active);
    (*((active.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_IKeyHandler)._vptr_IKeyHandler[2])
              (&(active.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_IKeyHandler,&kn,
               IVar8.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&active.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00172016:
  iVar5 = Screen::GetWidth();
  bVar3 = true;
  if (local_e4 == iVar5) {
    iVar5 = Screen::GetHeight();
    bVar3 = local_e8 != iVar5;
  }
  resized = (bool)(resized | bVar3);
  if (resized != false) {
    local_e4 = Screen::GetWidth();
    local_e8 = Screen::GetHeight();
    NotifyResized(this);
  }
  Layout(this);
  goto LAB_00171dc8;
}

Assistant:

void App::Run(ILayoutPtr layout) {
#ifdef WIN32
    if (App::Running(this->uniqueId, this->appTitle)) {
        return;
    }
#endif

    int64_t ch;
    std::string kn;

    this->state.input = nullptr;
    this->state.keyHandler = nullptr;
    int lastWidth = Screen::GetWidth();
    int lastHeight = Screen::GetHeight();

    this->ChangeLayout(layout);

    MEVENT rawMouseEvent;
    MouseButtonState mouseButtonState;

    while (!this->quit && !disconnected) {
        kn = "";

        if (this->injectedKeys.size()) {
            kn = injectedKeys.front();
            injectedKeys.pop();
            ch = ERR;
            goto process;
        }

        if (this->state.input && this->state.focused->GetContent()) {
            /* if the focused window is an input, allow it to draw a cursor */
            WINDOW *c = this->state.focused->GetContent();
            keypad(c, TRUE);
            wtimeout(c, IDLE_TIMEOUT_MS);
            ch = wgetch(c);
        }
        else {
            /* otherwise, no cursor */
            ch = wgetch(stdscr);
        }

        if (ch != ERR) {
            kn = key::Read((int) ch);

            if (this->keyHook) {
                if (this->keyHook(kn)) {
                    continue;
                }
            }

process:
            if (ch == '\t') { /* tab */
                this->FocusNextInLayout();
            }
            else if (kn == "KEY_BTAB") { /* shift-tab */
                this->FocusPrevInLayout();
            }
            else if (kn == this->quitKey) { /* ctrl+d quits */
                this->quit = true;
            }
#ifdef WIN32
            else if (kn == "KEY_RESIZE") {
                resized = true;
            }
#endif
            else if (this->mouseEnabled && kn == "KEY_MOUSE") {
#ifdef WIN32
                if (nc_getmouse(&rawMouseEvent) == 0) {
#else
                if (getmouse(&rawMouseEvent) == 0) {
#endif
                    auto active = this->state.ActiveLayout();
                    if (active) {
                        using Event = IMouseHandler::Event;
                        auto window = dynamic_cast<IWindow*>(active.get());
                        Event event(rawMouseEvent, window);
                        if (event.MouseWheelDown() || event.MouseWheelUp()) {
                            if (state.focused) {
                                state.focused->ProcessMouseEvent(event);
                            }
                        }
                        else if (mouseButtonState.Update(rawMouseEvent)) {
                            event.state = mouseButtonState.ToCursesState();
                            active->ProcessMouseEvent(event);
                        }
                    }
                }
            }
            /* order: focused input, global key handler, then layout. */
            else if (!this->state.input ||
                !this->state.focused->IsVisible() ||
                !this->state.input->Write(kn))
            {
                if (!keyHandler || !keyHandler(kn)) {
                    if (!this->state.keyHandler || !this->state.keyHandler->KeyPress(kn)) {
                        this->state.ActiveLayout()->KeyPress(kn);
                    }
                }
            }
        }

        resized |=
            lastWidth != Screen::GetWidth() ||
            lastHeight != Screen::GetHeight();
        if (resized) {
            lastWidth = Screen::GetWidth();
            lastHeight = Screen::GetHeight();
            this->NotifyResized();
        }

        this->Layout();
    }

    overlays.Clear();
}

void App::NotifyResized() {
    resized = false;
    resize_term(0, 0);
    Window::InvalidateScreen();
    if (this->resizeHandler) {
        this->resizeHandler();
    }
    this->OnResized();
}

void App::Layout() {
    this->CheckShowOverlay();
    this->EnsureFocusIsValid();

    /* we want to dispatch messages here, before we call WriteToScreen(),
    because dispatched messages may trigger UI updates, including layouts,
    which may lead panels to get destroyed and recreated, which can
    cause the screen to redraw outside of do_update() calls. so we dispatch
    messages, ensure our overlay is on top, then do a redraw. */
    Window::MessageQueue().Dispatch();

    if (this->state.overlayWindow) {
        this->state.overlay->BringToTop(); /* active overlay is always on top... */
    }

    /* always last to avoid flicker. see above. */
    Window::WriteToScreen(this->state.input);
}

void App::UpdateFocusedWindow(IWindowPtr window) {
    if (this->state.focused != window) {
        this->state.focused = window;
        this->state.input = dynamic_cast<IInput*>(window.get());
        this->state.keyHandler = dynamic_cast<IKeyHandler*>(window.get());

        if (this->state.focused) {
            this->state.focused->Focus();
        }
    }
}

void App::EnsureFocusIsValid() {
    ILayoutPtr layout = this->state.ActiveLayout();
    if (layout) {
        IWindowPtr focused = layout->GetFocus();
        if (focused != this->state.focused) {
            this->UpdateFocusedWindow(focused);
            Window::InvalidateScreen();
        }
    }
}

OverlayStack& App::Overlays() {
    return overlays;
}

void App::CheckShowOverlay() {
    ILayoutPtr top = overlays.Top();

    if (top != this->state.overlay) {
        if (this->state.overlay) {
            this->state.overlay->Hide();
        }

        this->state.overlay = top;

        this->state.overlayWindow =
            top ? dynamic_cast<IWindow*>(top.get()) : nullptr;

        ILayoutPtr newTopLayout = this->state.ActiveLayout();
        if (newTopLayout) {
            newTopLayout->Layout();
            newTopLayout->Show();
            newTopLayout->BringToTop();
            newTopLayout->FocusFirst();
        }
    }
}

ILayoutPtr App::GetLayout() {
    return this->state.layout;
}

void App::ChangeLayout(ILayoutPtr newLayout) {
    if (this->state.layout == newLayout) {
        return;
    }

    if (this->state.input && this->state.focused) {
        wtimeout(this->state.focused->GetContent(), IDLE_TIMEOUT_MS);
    }

    if (this->state.layout) {
        this->state.layout->Hide();
        this->state.layout.reset();
    }

    if (newLayout) {
        this->state.layout = newLayout;
        this->state.rootWindow = dynamic_cast<IWindow*>(this->state.layout.get());

        if (this->state.rootWindow) {
            this->state.rootWindow->MoveAndResize(
                0, 0, Screen::GetWidth(), Screen::GetHeight());
        }

        this->state.layout->Show();
        this->state.layout->BringToTop();

        if (!this->state.overlay) {
            this->UpdateFocusedWindow(this->state.layout->GetFocus());
        }
    }

    this->CheckShowOverlay();
}

void App::FocusNextInLayout() {
    if (!this->state.ActiveLayout()) {
        return;
    }

    this->UpdateFocusedWindow(this->state.ActiveLayout()->FocusNext());
}

void App::FocusPrevInLayout() {
    if (!this->state.ActiveLayout()) {
        return;
    }

    this->UpdateFocusedWindow(this->state.ActiveLayout()->FocusPrev());
}

int64_t App::Now() {
    return duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
}